

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O2

vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_> *
__thiscall
eos::fitting::concat<Eigen::Matrix<float,2,1,0,2,1>>
          (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           *__return_storage_ptr__,fitting *this,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *vec_a,vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                 *vec_b)

{
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  concatenated_vec;
  _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (Matrix<float,_2,_1,_0,_2,_1> *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  ::reserve((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             *)&local_38,
            ((long)(vec_a->
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(vec_a->
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) +
            (*(long *)(this + 8) - *(long *)this >> 3));
  std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
  insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>,void>
            ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
              *)&local_38,(const_iterator)local_38._M_impl.super__Vector_impl_data._M_finish,
             *(Matrix<float,_2,_1,_0,_2,_1> **)this,*(Matrix<float,_2,_1,_0,_2,_1> **)(this + 8));
  std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
  insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>,void>
            ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
              *)&local_38,(const_iterator)local_38._M_impl.super__Vector_impl_data._M_finish,
             (vec_a->
             super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (vec_a->
             super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = local_38._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = local_38._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  ::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline auto concat(const std::vector<T>& vec_a, const std::vector<T>& vec_b)
{
    std::vector<T> concatenated_vec;
    concatenated_vec.reserve(vec_a.size() + vec_b.size());
    concatenated_vec.insert(std::end(concatenated_vec), std::begin(vec_a), std::end(vec_a));
    concatenated_vec.insert(std::end(concatenated_vec), std::begin(vec_b), std::end(vec_b));
    return concatenated_vec;
}